

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNode * __thiscall Parser::len(Parser *this)

{
  bool bVar1;
  ExprNode *this_00;
  Token local_218;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  Token closeParen;
  ExprNode *id;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_80 [8];
  Token openParen;
  Parser *this_local;
  
  openParen._string.field_2._8_8_ = this;
  Tokenizer::getToken((Token *)local_80,this->tokenizer);
  bVar1 = Token::isOpenParen((Token *)local_80);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Parser::sub",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Expected an ( sign, instead got",
               (allocator<char> *)((long)&id + 7));
    die(this,&local_b0,&local_d8,(Token *)local_80);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&id + 7));
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  closeParen._string.field_2._8_8_ = variableID(this);
  Tokenizer::getToken((Token *)local_158,this->tokenizer);
  bVar1 = Token::isCloseParen((Token *)local_158);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Parser::sub",&local_179);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Expected an ) sign, instead got",&local_1a1);
    die(this,&local_178,&local_1a0,(Token *)local_158);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  this_00 = (ExprNode *)operator_new(0x80);
  ExprNode::token(&local_218,(ExprNode *)closeParen._string.field_2._8_8_);
  LengthExpr::LengthExpr((LengthExpr *)this_00,&local_218);
  Token::~Token(&local_218);
  Token::~Token((Token *)local_158);
  Token::~Token((Token *)local_80);
  return this_00;
}

Assistant:

ExprNode *Parser::len() {
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::sub", "Expected an ( sign, instead got", openParen);
    ExprNode *id = variableID();
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::sub", "Expected an ) sign, instead got", closeParen);
    return new LengthExpr(id->token());
}